

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

lua_Integer luaL_optinteger(lua_State *L,int idx,lua_Integer def)

{
  int iVar1;
  TValue *pTVar2;
  lua_Integer in_RDX;
  int in_ESI;
  lua_State *in_RDI;
  lua_Number n;
  TValue tmp;
  cTValue *o;
  TValue *in_stack_ffffffffffffffc8;
  lua_State *in_stack_ffffffffffffffd0;
  
  pTVar2 = index2adr(in_RDI,in_ESI);
  if ((pTVar2->field_2).it < 0xfffeffff) {
    in_stack_ffffffffffffffd0 = (lua_State *)pTVar2->n;
  }
  else {
    if ((pTVar2->field_2).it == 0xffffffff) {
      return in_RDX;
    }
    if (((pTVar2->field_2).it != 0xfffffffb) ||
       (iVar1 = lj_strscan_num((GCstr *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8),
       iVar1 == 0)) {
      lj_err_argt(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                  (int)in_stack_ffffffffffffffc8);
    }
  }
  return (long)(double)in_stack_ffffffffffffffd0;
}

Assistant:

LUALIB_API lua_Integer luaL_optinteger(lua_State *L, int idx, lua_Integer def)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  lua_Number n;
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else if (LJ_LIKELY(tvisnum(o))) {
    n = numV(o);
  } else if (tvisnil(o)) {
    return def;
  } else {
    if (!(tvisstr(o) && lj_strscan_number(strV(o), &tmp)))
      lj_err_argt(L, idx, LUA_TNUMBER);
    if (tvisint(&tmp))
      return (lua_Integer)intV(&tmp);
    n = numV(&tmp);
  }
#if LJ_64
  return (lua_Integer)n;
#else
  return lj_num2int(n);
#endif
}